

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

unique_ptr<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>_> __thiscall
spdlog::details::
make_unique<spdlog::json_formatter,std::unordered_set<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>>,std::__cxx11::string_const&>
          (details *this,
          unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
          *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  json_formatter *this_00;
  string local_40;
  
  this_00 = (json_formatter *)operator_new(0x60);
  std::__cxx11::string::string((string *)&local_40,(string *)args_1);
  json_formatter::json_formatter(this_00,args,&local_40);
  *(json_formatter **)this = this_00;
  std::__cxx11::string::~string((string *)&local_40);
  return (__uniq_ptr_data<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args &&...args)
{
    static_assert(!std::is_array<T>::value, "arrays not supported");
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}